

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha2.c
# Opt level: O1

char * SHA256_Data(sha2_byte *data,size_t len,char *digest)

{
  char *pcVar1;
  SHA256_CTX context;
  undefined1 local_78 [96];
  uint local_18 [2];
  
  local_78._0_4_ = 0x6a09e667;
  local_78._4_4_ = 0xbb67ae85;
  local_78._8_4_ = 0x3c6ef372;
  local_78._12_4_ = 0xa54ff53a;
  local_78._16_4_ = 0x510e527f;
  local_78._20_4_ = 0x9b05688c;
  local_78._24_4_ = 0x1f83d9ab;
  local_78._28_4_ = 0x5be0cd19;
  local_78._32_64_ = ZEXT864(0) << 0x20;
  local_18[0] = 0;
  local_18[1] = 0;
  SHA256_Update((SHA256_CTX *)local_78,data,len);
  pcVar1 = SHA256_End((SHA256_CTX *)local_78,digest);
  return pcVar1;
}

Assistant:

char* SHA256_Data(const sha2_byte* data, size_t len, char digest[SHA256_DIGEST_STRING_LENGTH]) {
	SHA256_CTX	context;

	SHA256_Init(&context);
	SHA256_Update(&context, data, len);
	return SHA256_End(&context, digest);
}